

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hxx
# Opt level: O2

Graph * __thiscall Graph::integrate(Graph *this)

{
  Matrix local_110;
  
  Matrix::transpose(&this->super_Matrix);
  Matrix::operator[](&local_110,&this->super_Matrix,1);
  Matrix::integrate(&local_110);
  Matrix::~Matrix(&local_110);
  Matrix::transpose(&this->super_Matrix);
  return this;
}

Assistant:

Graph& integrate() {
		transpose();
		operator[](1).integrate();
		transpose();
		return *this;
	}